

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall
Lodtalk::StackInterpreter::interpretPrimitive(StackInterpreter *this,int primitiveIndex)

{
  PrimitiveFunction primitive_00;
  PrimitiveFunction primitive;
  int primitiveIndex_local;
  StackInterpreter *this_local;
  
  if (primitiveIndex == 0x100) {
    findAndCallNamedPrimitive(this);
  }
  else {
    primitive_00 = VMContext::findPrimitive(this->context,primitiveIndex);
    if (primitive_00 == (PrimitiveFunction)0x0) {
      printf("unimplemented primitive: %d\n",(ulong)(uint)primitiveIndex);
    }
    else {
      callPrimitiveHere(this,primitive_00);
    }
  }
  return;
}

Assistant:

void interpretPrimitive(int primitiveIndex)
    {
        // Use a switch for the fast primitives.
        switch(primitiveIndex)
        {
        case 256:
            return findAndCallNamedPrimitive();
        default:
            // Go through the slow route.
            break;
        }

        // Call the normal primitive
        auto primitive = context->findPrimitive(primitiveIndex);
        if(primitive)
        {
            return callPrimitiveHere(primitive);
        }

        printf("unimplemented primitive: %d\n", primitiveIndex);
    }